

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_control_flow.cpp
# Opt level: O0

void hierarchical_condition(uint w)

{
  Task *pTVar1;
  Taskflow *pTVar2;
  Executor *this;
  Taskflow *f;
  Task mod2;
  Task sbf1;
  Task mod1;
  Task mod0;
  Task grab;
  Task sync;
  Task loop2;
  Task loop1;
  Task init;
  Task c2C;
  Task c2B;
  Task c2A;
  Task c1C;
  Task c1B;
  Task c1A;
  int c2_repeat;
  int c2;
  int c1;
  Taskflow tf3;
  Taskflow tf2;
  Taskflow tf1;
  Taskflow tf0;
  Executor executor;
  string *in_stack_fffffffffffff5e8;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffff5f0;
  Executor *this_00;
  string *in_stack_fffffffffffff608;
  Executor *this_01;
  Taskflow *in_stack_fffffffffffff610;
  allocator<char> *in_stack_fffffffffffff620;
  char *in_stack_fffffffffffff628;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff630;
  FlowBuilder *in_stack_fffffffffffff638;
  FlowBuilder *this_02;
  shared_ptr<tf::WorkerInterface> *wix;
  size_t in_stack_fffffffffffff6e0;
  Executor *in_stack_fffffffffffff6e8;
  undefined1 local_8d9 [41];
  Task local_8b0;
  undefined1 local_8a1 [33];
  undefined1 *local_880;
  Task local_870;
  allocator<char> local_861;
  string local_860 [40];
  Task local_838;
  allocator<char> local_829;
  string local_828 [40];
  Task local_800;
  undefined8 local_7f1;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  Task local_7b0;
  allocator<char> local_7a1;
  string local_7a0 [32];
  undefined1 *local_780;
  undefined1 *local_778;
  Task local_768;
  allocator<char> local_759;
  string local_758 [32];
  undefined1 *local_738;
  undefined1 *local_730;
  Task local_720;
  allocator<char> local_711;
  string local_710 [32];
  undefined1 *local_6f0;
  Task local_6e0;
  allocator<char> local_6d1;
  string local_6d0 [32];
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  Task local_690;
  allocator<char> local_681;
  string local_680 [39];
  allocator<char> local_659;
  string local_658 [39];
  allocator<char> local_631;
  string local_630 [32];
  undefined1 *local_610;
  undefined4 local_600;
  undefined1 *local_5f8;
  undefined1 *local_5e8;
  allocator<char> local_5d1;
  string local_5d0 [39];
  allocator<char> local_5a9;
  string local_5a8 [39];
  allocator<char> local_581;
  string local_580 [32];
  undefined1 *local_560;
  undefined4 local_550;
  undefined1 *local_548;
  undefined1 *local_538;
  undefined1 local_528 [4];
  undefined1 local_524 [4];
  undefined1 local_520 [7];
  allocator<char> local_519;
  string local_518 [239];
  allocator<char> local_429;
  string local_428 [239];
  allocator<char> local_339;
  string local_338 [32];
  undefined1 local_318 [207];
  allocator<char> local_249;
  string local_248 [248];
  shared_ptr<tf::WorkerInterface> local_150 [21];
  
  wix = local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Executor::Executor(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,wix);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11ce62);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  local_538 = local_520;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:538:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_8_1_3fcf64ec *)in_stack_fffffffffffff630);
  local_550 = 0;
  local_548 = local_520;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:539:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_16_2_abc4ca34 *)in_stack_fffffffffffff630);
  local_560 = local_520;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:542:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_8_1_3fcf64ec *)in_stack_fffffffffffff630);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff5f0,(Task *)in_stack_fffffffffffff5e8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff5f0,(Task *)in_stack_fffffffffffff5e8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff5f0,(Task *)in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator(&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  local_5e8 = local_524;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:551:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_8_1_3fcf64ed *)in_stack_fffffffffffff630);
  local_600 = 0;
  local_5f8 = local_524;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:552:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_16_2_abc4ca35 *)in_stack_fffffffffffff630);
  local_610 = local_524;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:555:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_8_1_3fcf64ed *)in_stack_fffffffffffff630);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff5f0,(Task *)in_stack_fffffffffffff5e8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff5f0,(Task *)in_stack_fffffffffffff5e8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff5f0,(Task *)in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  local_6b0 = local_520;
  local_6a8 = local_524;
  local_6a0 = local_528;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:564:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_24_3_6b8fd271 *)in_stack_fffffffffffff630);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  pTVar1 = tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_690,pTVar1);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  local_6f0 = local_524;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:568:28),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_8_1_3fcf64ed *)in_stack_fffffffffffff630);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  pTVar1 = tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_6e0,pTVar1);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator(&local_711);
  local_738 = local_524;
  local_730 = local_528;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:572:28),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_16_2_810930e7 *)in_stack_fffffffffffff630);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  pTVar1 = tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_720,pTVar1);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_759);
  local_780 = local_524;
  local_778 = local_528;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:577:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_16_2_810930e7 *)in_stack_fffffffffffff630);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  pTVar1 = tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_768,pTVar1);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  local_7d0 = local_520;
  local_7c8 = local_524;
  local_7c0 = local_528;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:583:27),_nullptr>
            (in_stack_fffffffffffff638,(anon_class_24_3_6b8fd271 *)in_stack_fffffffffffff630);
  this_02 = (FlowBuilder *)&local_7f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628,in_stack_fffffffffffff620);
  pTVar2 = (Taskflow *)tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_7b0,(Task *)pTVar2);
  std::__cxx11::string::~string((string *)((long)&local_7f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  tf::FlowBuilder::composed_of<tf::Taskflow>(this_02,pTVar2);
  __s = &local_829;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar2,(char *)__s
             ,in_stack_fffffffffffff620);
  this = (Executor *)tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_800,(Task *)this);
  std::__cxx11::string::~string(local_828);
  std::allocator<char>::~allocator(&local_829);
  tf::FlowBuilder::composed_of<tf::Taskflow>(this_02,pTVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar2,(char *)__s
             ,(allocator<char> *)this);
  pTVar1 = tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_838,pTVar1);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator(&local_861);
  local_880 = local_318;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:591:27),_nullptr>
            (this_02,(anon_class_8_1_ba1d7b5f *)pTVar2);
  this_01 = (Executor *)local_8a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar2,(char *)__s
             ,(allocator<char> *)this);
  f = (Taskflow *)tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_870,(Task *)f);
  std::__cxx11::string::~string((string *)(local_8a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_8a1);
  tf::FlowBuilder::composed_of<tf::Taskflow>(this_02,pTVar2);
  this_00 = (Executor *)local_8d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar2,(char *)__s
             ,(allocator<char> *)this);
  pTVar2 = (Taskflow *)tf::Task::name((Task *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  tf::Task::Task(&local_8b0,(Task *)pTVar2);
  std::__cxx11::string::~string((string *)(local_8d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_8d9);
  tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>
            ((Task *)f,(Task *)this_00,(Task *)pTVar2,(Task *)in_stack_fffffffffffff5e8);
  tf::Task::precede<tf::Task&,tf::Task&>((Task *)f,(Task *)this_00,(Task *)pTVar2);
  pTVar1 = tf::Task::succeed<tf::Task&>((Task *)pTVar2,(Task *)in_stack_fffffffffffff5e8);
  tf::Task::precede<tf::Task&,tf::Task&>((Task *)f,(Task *)this_00,(Task *)pTVar2);
  tf::Task::precede<tf::Task&>((Task *)pTVar2,pTVar1);
  tf::Task::precede<tf::Task&>((Task *)pTVar2,pTVar1);
  tf::Task::precede<tf::Task&>((Task *)pTVar2,pTVar1);
  tf::Task::precede<tf::Task&>((Task *)pTVar2,pTVar1);
  tf::Executor::run(this_00,pTVar2);
  tf::Future<void>::~Future((Future<void> *)pTVar2);
  tf::Executor::run_n(this_01,f,(size_t)this_00);
  tf::Future<void>::~Future((Future<void> *)pTVar2);
  tf::Executor::wait_for_all(this);
  tf::Taskflow::~Taskflow(pTVar2);
  tf::Taskflow::~Taskflow(pTVar2);
  tf::Taskflow::~Taskflow(pTVar2);
  tf::Taskflow::~Taskflow(pTVar2);
  tf::Executor::~Executor(this);
  return;
}

Assistant:

void hierarchical_condition(unsigned w) {

  tf::Executor executor(w);
  tf::Taskflow tf0("c0");
  tf::Taskflow tf1("c1");
  tf::Taskflow tf2("c2");
  tf::Taskflow tf3("top");

  int c1, c2, c2_repeat;

  auto c1A = tf1.emplace( [&](){ c1=0; } );
  auto c1B = tf1.emplace( [&, state=0] () mutable {
    REQUIRE(state++ % 100 == c1 % 100);
  });
  auto c1C = tf1.emplace( [&](){ return (++c1 < 100) ? 0 : 1; });

  c1A.precede(c1B);
  c1B.precede(c1C);
  c1C.precede(c1B);
  c1A.name("c1A");
  c1B.name("c1B");
  c1C.name("c1C");

  auto c2A = tf2.emplace( [&](){ REQUIRE(c2 == 100); c2 = 0; } );
  auto c2B = tf2.emplace( [&, state=0] () mutable {
      REQUIRE((state++ % 100) == (c2 % 100));
  });
  auto c2C = tf2.emplace( [&](){ return (++c2 < 100) ? 0 : 1; });

  c2A.precede(c2B);
  c2B.precede(c2C);
  c2C.precede(c2B);
  c2A.name("c2A");
  c2B.name("c2B");
  c2C.name("c2C");

  auto init = tf3.emplace([&](){
    c1=c2=c2_repeat=0;
  }).name("init");

  auto loop1 = tf3.emplace([&](){
    return (++c2 < 100) ? 0 : 1;
  }).name("loop1");

  auto loop2 = tf3.emplace([&](){
    c2 = 0;
    return ++c2_repeat < 100 ? 0 : 1;
  }).name("loop2");

  auto sync = tf3.emplace([&](){
    REQUIRE(c2==0);
    REQUIRE(c2_repeat==100);
    c2_repeat = 0;
  }).name("sync");

  auto grab = tf3.emplace([&](){
    REQUIRE(c1 == 100);
    REQUIRE(c2 == 0);
    REQUIRE(c2_repeat == 0);
  }).name("grab");

  auto mod0 = tf3.composed_of(tf0).name("module0");
  auto mod1 = tf3.composed_of(tf1).name("module1");
  auto sbf1 = tf3.emplace([&](tf::Subflow& sbf){
    auto sbf1_1 = sbf.emplace([](){}).name("sbf1_1");
    auto module1 = sbf.composed_of(tf1).name("module1");
    auto sbf1_2 = sbf.emplace([](){}).name("sbf1_2");
    sbf1_1.precede(module1);
    module1.precede(sbf1_2);
    sbf.join();
  }).name("sbf1");
  auto mod2 = tf3.composed_of(tf2).name("module2");

  init.precede(mod0, sbf1, loop1);
  loop1.precede(loop1, mod2);
  loop2.succeed(mod2).precede(loop1, sync);
  mod0.precede(grab);
  sbf1.precede(mod1);
  mod1.precede(grab);
  sync.precede(grab);

  executor.run(tf3);
  executor.run_n(tf3, 10);
  executor.wait_for_all();

  //tf3.dump(std::cout);
}